

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O0

Exa3_Man_t_conflict * Exa3_ManAlloc(Bmc_EsPar_t *pPars,word *pTruth)

{
  int iVar1;
  Exa3_Man_t_conflict *p_00;
  Vec_Wec_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  sat_solver *psVar4;
  Exa3_Man_t_conflict *p;
  word *pTruth_local;
  Bmc_EsPar_t *pPars_local;
  
  p_00 = (Exa3_Man_t_conflict *)calloc(1,0x60c8);
  p_00->pPars = pPars;
  p_00->nVars = pPars->nVars;
  p_00->nNodes = pPars->nNodes;
  p_00->nLutSize = pPars->nLutSize;
  p_00->LutMask = (1 << ((byte)pPars->nLutSize & 0x1f)) + -1;
  p_00->nObjs = pPars->nVars + pPars->nNodes;
  iVar1 = Abc_TtWordNum(pPars->nVars);
  p_00->nWords = iVar1;
  p_00->pTruth = pTruth;
  pVVar2 = Vec_WecStart(p_00->nObjs);
  p_00->vOutLits = pVVar2;
  iVar1 = Exa3_ManMarkup(p_00);
  p_00->iVar = iVar1;
  pVVar3 = Exa3_ManTruthTables(p_00);
  p_00->vInfo = pVVar3;
  psVar4 = sat_solver_new();
  p_00->pSat = psVar4;
  sat_solver_setnvars(p_00->pSat,p_00->iVar);
  return p_00;
}

Assistant:

static Exa3_Man_t * Exa3_ManAlloc( Bmc_EsPar_t * pPars, word * pTruth )
{
    Exa3_Man_t * p = ABC_CALLOC( Exa3_Man_t, 1 );
    p->pPars      = pPars;
    p->nVars      = pPars->nVars;
    p->nNodes     = pPars->nNodes;
    p->nLutSize   = pPars->nLutSize;
    p->LutMask    = (1 << pPars->nLutSize) - 1;
    p->nObjs      = pPars->nVars + pPars->nNodes;
    p->nWords     = Abc_TtWordNum(pPars->nVars);
    p->pTruth     = pTruth;
    p->vOutLits   = Vec_WecStart( p->nObjs );
    p->iVar       = Exa3_ManMarkup( p );
    p->vInfo      = Exa3_ManTruthTables( p );
    p->pSat       = sat_solver_new();
    sat_solver_setnvars( p->pSat, p->iVar );
    //Exa3_ManInitPolarity( p );
    return p;
}